

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::inverse(Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  int i;
  int j;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 local_48;
  float local_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  float local_20;
  float fStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  float local_c;
  
  puVar5 = &local_48;
  puVar6 = &local_48;
  if ((((this->x[0][3] != 0.0) || (fVar14 = this->x[1][3], fVar14 != 0.0)) || (NAN(fVar14))) ||
     (((fVar14 = this->x[2][3], fVar14 != 0.0 || (NAN(fVar14))) ||
      ((fVar14 = this->x[3][3], fVar14 != 1.0 || (NAN(fVar14))))))) {
    gjInverse(__return_storage_ptr__,this);
  }
  else {
    fVar14 = this->x[1][1];
    fVar11 = this->x[1][2];
    fVar12 = this->x[0][2];
    fVar15 = this->x[0][0];
    fVar1 = this->x[0][1];
    fVar2 = this->x[2][0];
    fVar3 = this->x[1][0];
    uVar4 = *(undefined8 *)(this->x[2] + 1);
    fVar17 = (float)uVar4;
    fVar18 = (float)((ulong)uVar4 >> 0x20);
    fVar16 = fVar14 * fVar18 - fVar11 * fVar17;
    local_38 = fVar2 * fVar11 - fVar18 * fVar3;
    local_48 = CONCAT44(fVar12 * fVar17 - fVar18 * fVar1,fVar16);
    local_40 = fVar1 * fVar11 - fVar12 * fVar14;
    fStack_3c = 0.0;
    fStack_34 = fVar18 * fVar15 - fVar12 * fVar2;
    fStack_30 = fVar12 * fVar3 - fVar11 * fVar15;
    fStack_2c = 0.0;
    fVar11 = fVar3 * fVar17 - fVar14 * fVar2;
    local_28 = CONCAT44(fVar2 * fVar1 - fVar17 * fVar15,fVar11);
    local_20 = fVar15 * fVar14 - fVar1 * fVar3;
    fStack_1c = 0.0;
    uStack_18 = 0;
    uStack_14 = 0;
    uStack_10 = 0;
    local_c = 1.0;
    fVar11 = fVar11 * fVar12 + fVar16 * fVar15 + local_38 * fVar1;
    fVar14 = fVar11;
    if (fVar11 <= -fVar11) {
      fVar14 = -fVar11;
    }
    if (1.0 <= fVar14) {
      lVar9 = 0;
      do {
        lVar8 = 0;
        do {
          *(float *)((long)puVar6 + lVar8 * 4) = *(float *)((long)puVar6 + lVar8 * 4) / fVar11;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar9 = lVar9 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0x10);
      } while (lVar9 != 3);
    }
    else {
      uVar7 = 0;
      bVar10 = false;
      do {
        lVar9 = 0;
        do {
          fVar12 = *(float *)((long)puVar5 + lVar9 * 4);
          fVar15 = fVar12;
          if (fVar12 <= -fVar12) {
            fVar15 = -fVar12;
          }
          if (fVar14 * 8.507059e+37 <= fVar15) {
            __return_storage_ptr__->x[0][0] = 1.0;
            auVar13._0_12_ = ZEXT812(0);
            auVar13._12_4_ = 0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[0] + 1) = auVar13;
            __return_storage_ptr__->x[1][1] = 1.0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[1] + 2) = auVar13;
            __return_storage_ptr__->x[2][2] = 1.0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[2] + 3) = auVar13;
            __return_storage_ptr__->x[3][3] = 1.0;
            if (!bVar10) {
              return __return_storage_ptr__;
            }
            goto LAB_0015aa73;
          }
          *(float *)((long)puVar5 + lVar9 * 4) = fVar12 / fVar11;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        bVar10 = 1 < uVar7;
        uVar7 = uVar7 + 1;
        puVar5 = (undefined8 *)((long)puVar5 + 0x10);
      } while (uVar7 != 3);
    }
LAB_0015aa73:
    fVar12 = (float)((uint)this->x[3][0] ^ (uint)DAT_001b34a0);
    fVar14 = this->x[3][1];
    fVar11 = this->x[3][2];
    fVar15 = (float)((ulong)local_28 >> 0x20);
    *(undefined8 *)__return_storage_ptr__->x[0] = local_48;
    __return_storage_ptr__->x[0][2] = local_40;
    __return_storage_ptr__->x[0][3] = fStack_3c;
    __return_storage_ptr__->x[1][0] = local_38;
    __return_storage_ptr__->x[1][1] = fStack_34;
    __return_storage_ptr__->x[1][2] = fStack_30;
    __return_storage_ptr__->x[1][3] = fStack_2c;
    __return_storage_ptr__->x[2][0] = (float)local_28;
    __return_storage_ptr__->x[2][1] = fVar15;
    __return_storage_ptr__->x[2][2] = local_20;
    __return_storage_ptr__->x[2][3] = fStack_1c;
    __return_storage_ptr__->x[3][0] =
         (fVar12 * (float)local_48 - fVar14 * local_38) - fVar11 * (float)local_28;
    __return_storage_ptr__->x[3][1] =
         (fVar12 * (float)((ulong)local_48 >> 0x20) - fVar14 * fStack_34) - fVar11 * fVar15;
    __return_storage_ptr__->x[3][2] = (fVar12 * local_40 - fVar14 * fStack_30) - fVar11 * local_20;
    __return_storage_ptr__->x[3][3] = local_c;
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix44<T>
                 Matrix44<T>::inverse () const IMATH_NOEXCEPT
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse ();

    Matrix44 s (
        x[1][1] * x[2][2] - x[2][1] * x[1][2],
        x[2][1] * x[0][2] - x[0][1] * x[2][2],
        x[0][1] * x[1][2] - x[1][1] * x[0][2],
        0,

        x[2][0] * x[1][2] - x[1][0] * x[2][2],
        x[0][0] * x[2][2] - x[2][0] * x[0][2],
        x[1][0] * x[0][2] - x[0][0] * x[1][2],
        0,

        x[1][0] * x[2][1] - x[2][0] * x[1][1],
        x[2][0] * x[0][1] - x[0][0] * x[2][1],
        x[0][0] * x[1][1] - x[1][0] * x[0][1],
        0,

        0,
        0,
        0,
        1);

    T r = x[0][0] * s.x[0][0] + x[0][1] * s.x[1][0] + x[0][2] * s.x[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s.x[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                {
                    s.x[i][j] /= r;
                }
                else
                {
                    return Matrix44 ();
                }
            }
        }
    }

    s.x[3][0] =
        -x[3][0] * s.x[0][0] - x[3][1] * s.x[1][0] - x[3][2] * s.x[2][0];
    s.x[3][1] =
        -x[3][0] * s.x[0][1] - x[3][1] * s.x[1][1] - x[3][2] * s.x[2][1];
    s.x[3][2] =
        -x[3][0] * s.x[0][2] - x[3][1] * s.x[1][2] - x[3][2] * s.x[2][2];

    return s;
}